

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

void opj_pi_update_encode_not_poc
               (opj_cp_t *p_cp,OPJ_UINT32 p_num_comps,OPJ_UINT32 p_tileno,OPJ_UINT32 p_tx0,
               OPJ_UINT32 p_tx1,OPJ_UINT32 p_ty0,OPJ_UINT32 p_ty1,OPJ_UINT32 p_max_prec,
               OPJ_UINT32 p_max_res,OPJ_UINT32 p_dx_min,OPJ_UINT32 p_dy_min)

{
  OPJ_UINT32 OVar1;
  opj_tcp_t *poVar2;
  opj_poc_t *poStack_38;
  OPJ_UINT32 l_poc_bound;
  opj_poc_t_conflict *l_current_poc;
  opj_tcp_t *l_tcp;
  OPJ_UINT32 pino;
  OPJ_UINT32 p_ty0_local;
  OPJ_UINT32 p_tx1_local;
  OPJ_UINT32 p_tx0_local;
  OPJ_UINT32 p_tileno_local;
  OPJ_UINT32 p_num_comps_local;
  opj_cp_t *p_cp_local;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                  ,0x4a3,
                  "void opj_pi_update_encode_not_poc(opj_cp_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32)"
                 );
  }
  if (p_tileno < p_cp->tw * p_cp->th) {
    poVar2 = p_cp->tcps;
    OVar1 = poVar2[p_tileno].numpocs;
    poStack_38 = poVar2[p_tileno].pocs;
    for (l_tcp._0_4_ = 0; (uint)l_tcp < OVar1 + 1; l_tcp._0_4_ = (uint)l_tcp + 1) {
      poStack_38->compS = 0;
      poStack_38->compE = p_num_comps;
      poStack_38->resS = 0;
      poStack_38->resE = p_max_res;
      poStack_38->layS = 0;
      poStack_38->layE = poVar2[p_tileno].numlayers;
      poStack_38->prg = poVar2[p_tileno].prg;
      poStack_38->prcS = 0;
      poStack_38->prcE = p_max_prec;
      poStack_38->txS = p_tx0;
      poStack_38->txE = p_tx1;
      poStack_38->tyS = p_ty0;
      poStack_38->tyE = p_ty1;
      poStack_38->dx = p_dx_min;
      poStack_38->dy = p_dy_min;
      poStack_38 = poStack_38 + 1;
    }
    return;
  }
  __assert_fail("p_tileno < p_cp->tw * p_cp->th",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/pi.c"
                ,0x4a4,
                "void opj_pi_update_encode_not_poc(opj_cp_t *, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32, OPJ_UINT32)"
               );
}

Assistant:

static void opj_pi_update_encode_not_poc(opj_cp_t *p_cp,
        OPJ_UINT32 p_num_comps,
        OPJ_UINT32 p_tileno,
        OPJ_UINT32 p_tx0,
        OPJ_UINT32 p_tx1,
        OPJ_UINT32 p_ty0,
        OPJ_UINT32 p_ty1,
        OPJ_UINT32 p_max_prec,
        OPJ_UINT32 p_max_res,
        OPJ_UINT32 p_dx_min,
        OPJ_UINT32 p_dy_min)
{
    /* loop*/
    OPJ_UINT32 pino;
    /* tile coding parameter*/
    opj_tcp_t *l_tcp = 00;
    /* current poc being updated*/
    opj_poc_t * l_current_poc = 00;
    /* number of pocs*/
    OPJ_UINT32 l_poc_bound;

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_tileno < p_cp->tw * p_cp->th);

    /* initializations*/
    l_tcp = &p_cp->tcps [p_tileno];

    /* number of iterations in the loop */
    l_poc_bound = l_tcp->numpocs + 1;

    /* start at first element, and to make sure the compiler will not make a calculation each time in the loop
       store a pointer to the current element to modify rather than l_tcp->pocs[i]*/
    l_current_poc = l_tcp->pocs;

    for (pino = 0; pino < l_poc_bound ; ++pino) {
        l_current_poc->compS = 0;
        l_current_poc->compE = p_num_comps;/*p_image->numcomps;*/
        l_current_poc->resS = 0;
        l_current_poc->resE = p_max_res;
        l_current_poc->layS = 0;
        l_current_poc->layE = l_tcp->numlayers;
        l_current_poc->prg  = l_tcp->prg;
        l_current_poc->prcS = 0;
        l_current_poc->prcE = p_max_prec;
        l_current_poc->txS = p_tx0;
        l_current_poc->txE = p_tx1;
        l_current_poc->tyS = p_ty0;
        l_current_poc->tyE = p_ty1;
        l_current_poc->dx = p_dx_min;
        l_current_poc->dy = p_dy_min;
        ++ l_current_poc;
    }
}